

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCentroidCount
          (VClient *this,string *i_rCameraName,uint *o_rCount)

{
  Enum EVar1;
  bool bVar2;
  VCameraInfo *pVVar3;
  VCentroids *pVVar4;
  size_type sVar5;
  VCentroids *pCentroidSet;
  VCameraInfo *pCamera;
  Enum local_3c;
  undefined1 local_38 [4];
  Enum GetResult;
  scoped_lock Lock;
  uint *o_rCount_local;
  string *i_rCameraName_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rCount;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38,&this->m_FrameMutex);
  local_3c = Success;
  bVar2 = InitGet<unsigned_int>(this,&local_3c,(uint *)Lock._8_8_);
  if (((bVar2) && (pVVar3 = GetCamera(this,i_rCameraName,&local_3c), pVVar3 != (VCameraInfo *)0x0))
     && (pVVar4 = GetCentroidSet(this,pVVar3->m_CameraID,&local_3c), pVVar4 != (VCentroids *)0x0)) {
    sVar5 = std::
            vector<ViconCGStreamDetail::VCentroids_Centroid,_std::allocator<ViconCGStreamDetail::VCentroids_Centroid>_>
            ::size(&pVVar4->m_Centroids);
    *(int *)Lock._8_8_ = (int)sVar5;
  }
  EVar1 = local_3c;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_38);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCentroidCount( const std::string & i_rCameraName, unsigned int & o_rCount ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Result::Enum GetResult = Result::Success;
  if( InitGet( GetResult, o_rCount ) )
  {
    const ViconCGStream::VCameraInfo* pCamera = GetCamera( i_rCameraName, GetResult );
    if( !pCamera )
    {
      return GetResult;
    }

    const ViconCGStream::VCentroids* pCentroidSet = GetCentroidSet( pCamera->m_CameraID, GetResult );
    if( pCentroidSet )
    {
      o_rCount = static_cast< unsigned int >( pCentroidSet->m_Centroids.size() );
    }
  }
  return GetResult;
}